

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_context.c
# Opt level: O2

char * rfc5444_strerror(rfc5444_result result)

{
  char **ppcVar1;
  
  if ((uint)result < 6) {
    ppcVar1 = _rfc5444_positive_result_texts + (uint)result;
  }
  else {
    if ((uint)result < 0xffffffec) {
      return "Unknown RFC5444-API result";
    }
    ppcVar1 = _rfc5444_negative_result_texts + (uint)-result;
  }
  return *ppcVar1;
}

Assistant:

const char *
rfc5444_strerror(enum rfc5444_result result) {
  const char *UNKNOWN = "Unknown RFC5444-API result";
  if (result >= RFC5444_OKAY && result <= RFC5444_RESULT_MAX) {
    return _rfc5444_positive_result_texts[result];
  }
  if (result < RFC5444_OKAY && result >= RFC5444_RESULT_MIN) {
    return _rfc5444_negative_result_texts[-result];
  }
  return UNKNOWN;
}